

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# udf_functions_to_test.hpp
# Opt level: O0

void duckdb::UDFCovarOperation::
     Operation<int,int,duckdb::udf_covar_state_t,duckdb::UDFCovarPopOperation>
               (udf_covar_state_t *state,int *x,int *y,AggregateBinaryInput *idata)

{
  int iVar1;
  uint64_t uVar2;
  double dVar3;
  double dVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  double C;
  double meany;
  double dy;
  double meanx;
  double dx;
  uint64_t n;
  AggregateBinaryInput *idata_local;
  int *y_local;
  int *x_local;
  udf_covar_state_t *state_local;
  undefined4 uVar7;
  
  uVar2 = state->count + 1;
  state->count = uVar2;
  dVar3 = (double)*x - state->meanx;
  uVar7 = (undefined4)(uVar2 >> 0x20);
  auVar5._8_4_ = uVar7;
  auVar5._0_8_ = uVar2;
  auVar5._12_4_ = 0x45300000;
  auVar6._8_4_ = uVar7;
  auVar6._0_8_ = uVar2;
  auVar6._12_4_ = 0x45300000;
  dVar4 = state->meany +
          ((double)*y - state->meany) /
          ((auVar6._8_8_ - 1.9342813113834067e+25) +
          ((double)CONCAT44(0x43300000,(int)uVar2) - 4503599627370496.0));
  iVar1 = *y;
  state->meanx = state->meanx +
                 dVar3 / ((auVar5._8_8_ - 1.9342813113834067e+25) +
                         ((double)CONCAT44(0x43300000,(int)uVar2) - 4503599627370496.0));
  state->meany = dVar4;
  state->co_moment = dVar3 * ((double)iVar1 - dVar4) + state->co_moment;
  return;
}

Assistant:

static void Operation(STATE &state, const A_TYPE &x, const B_TYPE &y, AggregateBinaryInput &idata) {
		// update running mean and d^2
		const uint64_t n = ++(state.count);

		const double dx = (x - state.meanx);
		const double meanx = state.meanx + dx / n;

		const double dy = (y - state.meany);
		const double meany = state.meany + dy / n;

		const double C = state.co_moment + dx * (y - meany);

		state.meanx = meanx;
		state.meany = meany;
		state.co_moment = C;
	}